

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O3

void __thiscall adios2::query::RangeTree::AddLeaf(RangeTree *this,Op op,string *value)

{
  Range range;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_38._0_4_ = op;
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::_M_assign((string *)&local_30);
  std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::push_back
            (&this->m_Leaves,(value_type *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void AddLeaf(adios2::query::Op op, std::string value)
    {
        Range range;
        range.m_Op = op;
        range.m_StrValue = value;

        m_Leaves.push_back(range);
    }